

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SAXParser::endElement
          (SAXParser *this,XMLElementDecl *elemDecl,uint uriId,bool isRoot,XMLCh *elemPrefix)

{
  XMLBuffer *this_00;
  XMLCh *pXVar1;
  long lVar2;
  DocumentHandler *pDVar3;
  XMLSize_t index;
  ulong uVar4;
  
  pDVar3 = this->fDocHandler;
  if (pDVar3 != (DocumentHandler *)0x0) {
    if (this->fScanner->fDoNamespaces == true) {
      if ((elemPrefix == (XMLCh *)0x0) || (*elemPrefix == L'\0')) {
        pXVar1 = elemDecl->fElementName->fLocalPart;
        lVar2 = *(long *)pDVar3;
      }
      else {
        this_00 = &this->fElemQNameBuf;
        XMLBuffer::set(this_00,elemPrefix);
        XMLBuffer::append(this_00,L':');
        XMLBuffer::append(this_00,elemDecl->fElementName->fLocalPart);
        pXVar1 = (this->fElemQNameBuf).fBuffer;
        pDVar3 = this->fDocHandler;
        pXVar1[(this->fElemQNameBuf).fIndex] = L'\0';
        lVar2 = *(long *)pDVar3;
      }
      (**(code **)(lVar2 + 0x20))(pDVar3,pXVar1);
    }
    else {
      pXVar1 = XMLElementDecl::getFullName(elemDecl);
      (**(code **)(*(long *)pDVar3 + 0x20))(pDVar3,pXVar1);
    }
  }
  for (uVar4 = 0; uVar4 < this->fAdvDHCount; uVar4 = uVar4 + 1) {
    (*this->fAdvDHList[uVar4]->_vptr_XMLDocumentHandler[6])
              (this->fAdvDHList[uVar4],elemDecl,(ulong)uriId,(ulong)isRoot,elemPrefix);
  }
  if (this->fElemDepth != 0) {
    this->fElemDepth = this->fElemDepth - 1;
  }
  return;
}

Assistant:

void SAXParser::endElement( const   XMLElementDecl& elemDecl
                            , const unsigned int    uriId
                            , const bool            isRoot
                            , const XMLCh* const    elemPrefix)
{
    // Just map to the SAX document handler
    if (fDocHandler) {
        if (fScanner->getDoNamespaces()) {

            if (elemPrefix && *elemPrefix) {

                fElemQNameBuf.set(elemPrefix);
                fElemQNameBuf.append(chColon);
                fElemQNameBuf.append(elemDecl.getBaseName());
                fDocHandler->endElement(fElemQNameBuf.getRawBuffer());
            }
            else {
                fDocHandler->endElement(elemDecl.getBaseName());
            }
        }
        else
            fDocHandler->endElement(elemDecl.getFullName());

    }

    //
    //  If there are any installed advanced handlers, then lets call them
    //  with this info.
    //
    for (XMLSize_t index = 0; index < fAdvDHCount; index++)
        fAdvDHList[index]->endElement(elemDecl, uriId, isRoot, elemPrefix);

    //
    //  Dump the element depth down again. Don't let it underflow in case
    //  of malformed XML.
    //
    if (fElemDepth)
        fElemDepth--;
}